

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::DumpVarsTask::bindArgument
          (DumpVarsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Compilation *pCVar1;
  ExpressionSyntax *pEVar2;
  bool bVar3;
  Type *pTVar4;
  InvalidExpression *pIVar5;
  Compilation *compilation;
  HierarchicalReferenceExpression *pHVar6;
  InstanceSymbol *this_00;
  Scope *this_01;
  VariableSymbol *pVVar7;
  Diagnostic *this_02;
  Expression *pEVar8;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  Expression *local_98;
  SourceLocation local_90;
  SourceLocation local_88;
  undefined4 local_7c;
  Symbol *local_78;
  Symbol *sym;
  Expression *local_68;
  Expression *ref;
  SourceRange local_58;
  DiagCode local_44;
  Compilation *local_40;
  Compilation *comp;
  Args *args_local;
  ExpressionSyntax *syntax_local;
  ASTContext *context_local;
  size_t argIndex_local;
  DumpVarsTask *this_local;
  
  comp = (Compilation *)args;
  args_local = (Args *)syntax;
  syntax_local = (ExpressionSyntax *)context;
  context_local = (ASTContext *)argIndex;
  argIndex_local = (size_t)this;
  if (argIndex == 0) {
    pEVar8 = SystemSubroutine::bindArgument((SystemSubroutine *)this,0,context,syntax,args);
    return pEVar8;
  }
  local_40 = ASTContext::getCompilation(context);
  extraLookupFlags.m_bits = (underlying_type)args;
  bVar3 = slang::syntax::NameSyntax::isKind((SyntaxKind)args_local->size_);
  pEVar2 = syntax_local;
  pCVar1 = local_40;
  if (!bVar3) {
    local_44.subsystem = SysFuncs;
    local_44.code = 10;
    local_58 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)args_local);
    ASTContext::addDiag((ASTContext *)pEVar2,local_44,local_58);
    pCVar1 = local_40;
    ref = (Expression *)0x0;
    pTVar4 = Compilation::getErrorType(local_40);
    pIVar5 = BumpAllocator::
             emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                       (&pCVar1->super_BumpAllocator,&ref,pTVar4);
    return &pIVar5->super_Expression;
  }
  compilation = (Compilation *)
                slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>((SyntaxNode *)args_local);
  pEVar2 = syntax_local;
  memset((void *)((long)&sym + 4),0,4);
  bitmask<slang::ast::LookupFlags>::bitmask((bitmask<slang::ast::LookupFlags> *)((long)&sym + 4));
  local_68 = HierarchicalReferenceExpression::fromSyntax
                       ((HierarchicalReferenceExpression *)pCVar1,compilation,(NameSyntax *)pEVar2,
                        (ASTContext *)(ulong)sym._4_4_,extraLookupFlags);
  if (local_68->kind == HierarchicalReference) {
    pHVar6 = Expression::as<slang::ast::HierarchicalReferenceExpression>(local_68);
    local_78 = not_null<const_slang::ast::Symbol_*>::operator*(&pHVar6->symbol);
    if ((local_78->kind != Variable) && (local_78->kind != Net)) {
      if (local_78->kind != Instance) {
LAB_00635988:
        this_01 = not_null<const_slang::ast::Scope_*>::operator->
                            ((not_null<const_slang::ast::Scope_*> *)syntax_local);
        bVar3 = Scope::isUninstantiated(this_01);
        if (!bVar3) {
          local_7c = 0xa000b;
          local_90 = (local_68->sourceRange).startLoc;
          local_88 = (local_68->sourceRange).endLoc;
          ASTContext::addDiag((ASTContext *)syntax_local,(DiagCode)0xa000b,local_68->sourceRange);
        }
        pCVar1 = local_40;
        local_98 = local_68;
        pTVar4 = Compilation::getErrorType(local_40);
        pIVar5 = BumpAllocator::
                 emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                           (&pCVar1->super_BumpAllocator,&local_98,pTVar4);
        return &pIVar5->super_Expression;
      }
      this_00 = Symbol::as<slang::ast::InstanceSymbol>(local_78);
      bVar3 = InstanceSymbol::isModule(this_00);
      if (!bVar3) goto LAB_00635988;
    }
    bVar3 = VariableSymbol::isKind(local_78->kind);
    if ((bVar3) &&
       (pVVar7 = Symbol::as<slang::ast::VariableSymbol>(local_78), pVVar7->lifetime == Automatic)) {
      this_02 = ASTContext::addDiag((ASTContext *)syntax_local,(DiagCode)0x4000b,
                                    local_68->sourceRange);
      Diagnostic::operator<<(this_02,local_78->name);
    }
  }
  return local_68;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex > 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModOrVarName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = HierarchicalReferenceExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                                    context);

            if (ref.kind == ExpressionKind::HierarchicalReference) {
                auto& sym = *ref.as<HierarchicalReferenceExpression>().symbol;
                if (sym.kind != SymbolKind::Variable && sym.kind != SymbolKind::Net &&
                    (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModOrVarName, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
                else if (VariableSymbol::isKind(sym.kind) &&
                         sym.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                    context.addDiag(diag::AutoVarTraced, ref.sourceRange) << sym.name;
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }